

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O3

bool __thiscall ON_Hatch::ReplaceLoops(ON_Hatch *this,ON_SimpleArray<const_ON_Curve_*> *loop_curves)

{
  ON_HatchLoop **__s;
  int iVar1;
  ON_Curve *pCurve2d;
  ON_HatchLoop *pOVar2;
  long lVar3;
  ON_Plane *pOVar4;
  ON_Xform *pOVar5;
  ON_Plane *pOVar6;
  ON_Xform *pOVar7;
  long lVar8;
  bool bVar9;
  byte bVar10;
  ON_SimpleArray<ON_HatchLoop_*> loops;
  ON_Plane hplane;
  ON_HatchLoop *loop;
  ON_Xform xf;
  ON_Xform flatxf;
  ON_SimpleArray<ON_HatchLoop_*> local_2d8;
  ON_Plane *local_2c0;
  ON_Plane local_2b8;
  ON_Xform local_230;
  ON_Xform local_1b0;
  ON_Xform local_130;
  ON_Xform local_b0;
  
  bVar10 = 0;
  if (loop_curves->m_count < 1) {
    return false;
  }
  ON_Xform::ON_Xform(&local_1b0);
  local_2d8._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00810470;
  local_2d8.m_a = (ON_HatchLoop **)0x0;
  local_2d8.m_count = 0;
  local_2d8.m_capacity = 0;
  if (0 < loop_curves->m_count) {
    local_2c0 = &this->m_plane;
    lVar8 = 0;
    bVar9 = false;
    do {
      if ((loop_curves->m_a[lVar8] == (ON_Curve *)0x0) ||
         (pCurve2d = ON_Curve::Duplicate(loop_curves->m_a[lVar8]), pCurve2d == (ON_Curve *)0x0)) {
LAB_004996bc:
        if (0 < local_2d8.m_count) {
          lVar8 = 0;
          do {
            pOVar2 = local_2d8.m_a[lVar8];
            if (pOVar2 == (ON_HatchLoop *)0x0) {
              onfree((void *)0x0);
            }
            else {
              ON_HatchLoop::~ON_HatchLoop(pOVar2);
              onfree(pOVar2);
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < local_2d8.m_count);
        }
        if (local_2d8.m_a != (ON_HatchLoop **)0x0) {
          memset(local_2d8.m_a,0,(long)local_2d8.m_capacity << 3);
        }
        local_2d8._16_8_ = local_2d8._16_8_ & 0xffffffff00000000;
        goto LAB_0049971c;
      }
      iVar1 = (*(pCurve2d->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])(pCurve2d);
      if (iVar1 == 3) {
        if (!bVar9) {
          ON_Xform::ON_Xform(&local_230);
          ON_Xform::ON_Xform(&local_130);
          pOVar4 = &ON_xy_plane;
          pOVar6 = &local_2b8;
          for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
            (pOVar6->origin).x = (pOVar4->origin).x;
            pOVar4 = (ON_Plane *)((long)pOVar4 + ((ulong)bVar10 * -2 + 1) * 8);
            pOVar6 = (ON_Plane *)((long)pOVar6 + (ulong)bVar10 * -0x10 + 8);
          }
          local_2b8.origin.z = (local_2c0->origin).z;
          local_2b8.origin.x = (local_2c0->origin).x;
          local_2b8.origin.y = (local_2c0->origin).y;
          ON_Xform::Rotation(&local_230,local_2c0,&local_2b8);
          ON_Xform::PlanarProjection(&local_130,&local_2b8);
          ON_Xform::operator*(&local_b0,&local_130,&local_230);
          pOVar5 = &local_b0;
          pOVar7 = &local_1b0;
          for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
            pOVar7->m_xform[0][0] = pOVar5->m_xform[0][0];
            pOVar5 = (ON_Xform *)((long)pOVar5 + ((ulong)bVar10 * -2 + 1) * 8);
            pOVar7 = (ON_Xform *)((long)pOVar7 + ((ulong)bVar10 * -2 + 1) * 8);
          }
          ON_Plane::~ON_Plane(&local_2b8);
        }
        iVar1 = (*(pCurve2d->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])(pCurve2d);
        if ((char)iVar1 != '\0') {
          iVar1 = (*(pCurve2d->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(pCurve2d);
          bVar9 = true;
          if ((char)iVar1 != '\0') goto LAB_0049959d;
        }
        (*(pCurve2d->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
        goto LAB_004996bc;
      }
LAB_0049959d:
      pOVar2 = (ON_HatchLoop *)onmalloc(0x10);
      ON_HatchLoop::ON_HatchLoop(pOVar2,pCurve2d,(uint)(local_2d8.m_count != 0));
      local_230.m_xform[0][0] = (double)pOVar2;
      if (pOVar2 == (ON_HatchLoop *)0x0) {
        (*(pCurve2d->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
      }
      else {
        ON_SimpleArray<ON_HatchLoop_*>::Append(&local_2d8,(ON_HatchLoop **)&local_230);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < loop_curves->m_count);
    bVar9 = 0 < local_2d8.m_count;
    if (0 < local_2d8.m_count) {
      if (0 < (this->m_loops).m_count) {
        lVar8 = 0;
        do {
          pOVar2 = (this->m_loops).m_a[lVar8];
          if (pOVar2 == (ON_HatchLoop *)0x0) {
            onfree((void *)0x0);
          }
          else {
            ON_HatchLoop::~ON_HatchLoop(pOVar2);
            onfree(pOVar2);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < (this->m_loops).m_count);
      }
      __s = (this->m_loops).m_a;
      if (__s != (ON_HatchLoop **)0x0) {
        memset(__s,0,(long)(this->m_loops).m_capacity << 3);
      }
      (this->m_loops).m_count = 0;
      if (0 < local_2d8.m_count) {
        lVar8 = 0;
        lVar3 = 0;
        do {
          ON_SimpleArray<ON_HatchLoop_*>::Append
                    (&this->m_loops,(ON_HatchLoop **)((long)local_2d8.m_a + lVar8));
          lVar3 = lVar3 + 1;
          lVar8 = lVar8 + 8;
        } while (lVar3 < local_2d8.m_count);
      }
      goto LAB_0049971e;
    }
  }
LAB_0049971c:
  bVar9 = false;
LAB_0049971e:
  ON_SimpleArray<ON_HatchLoop_*>::~ON_SimpleArray(&local_2d8);
  return bVar9;
}

Assistant:

bool ON_Hatch::ReplaceLoops(ON_SimpleArray<const ON_Curve*>& loop_curves)
{
  if(loop_curves.Count() < 1)
    return false;

  bool rc = true;
  ON_Xform xf;
  bool flat = false;
  ON_SimpleArray<ON_HatchLoop*> loops;

  for(int i = 0; i < loop_curves.Count(); i++)
  {
    if(loop_curves[i] == 0)
    {
      rc = false;
      break;
    }
    ON_Curve* p2d = loop_curves[i]->Duplicate();
    if(p2d == 0)
    {
      rc = false;
      break;
    }
    if(p2d->Dimension() == 3)
    {
      if(!flat)
      {
        ON_Xform planexf, flatxf;
        ON_Plane hplane(ON_xy_plane);
        hplane.origin = m_plane.origin;
        planexf.Rotation(m_plane, hplane);
        flatxf.PlanarProjection(hplane);
        xf = flatxf * planexf;
        flat = true;
      }
      if(!p2d->Transform(xf) ||
         !p2d->ChangeDimension(2))
      {
        delete p2d;
        rc = false;
        break;
      }
    }
    ON_HatchLoop* loop = new ON_HatchLoop(p2d,loops.Count()?ON_HatchLoop::ltInner:ON_HatchLoop::ltOuter);
    if(loop)
      loops.Append(loop);
    else
      delete p2d;
  }
  if(!rc)
  {
    for(int i = 0; i < loops.Count(); i++)
      delete loops[i];

    loops.Empty();
  }

  if(loops.Count() < 1)
    return false;

  for(int i = 0; i < m_loops.Count(); i++)
    delete m_loops[i];
  m_loops.Empty();
  for(int i = 0; i < loops.Count(); i++)
    m_loops.Append(loops[i]);
  return true;
}